

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirentryinfo_p.h
# Opt level: O3

bool __thiscall QDirEntryInfo::isReadable(QDirEntryInfo *this)

{
  bool bVar1;
  
  if ((this->fileInfoOpt).super__Optional_base<QFileInfo,_false,_false>._M_payload.
      super__Optional_payload<QFileInfo,_true,_false,_false>.super__Optional_payload_base<QFileInfo>
      ._M_engaged == true) {
    bVar1 = QFileInfo::isReadable((QFileInfo *)&this->fileInfoOpt);
    return bVar1;
  }
  if (((this->metaData).knownFlagsMask.
       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x400) == 0) {
    QFileSystemEngine::fillMetaData(&this->entry,&this->metaData,(MetaDataFlags)0x400);
  }
  return (bool)((*(byte *)((long)&(this->metaData).entryFlags.
                                  super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 1) & 4)
               >> 2);
}

Assistant:

bool isReadable() {
        if (fileInfoOpt)
            return fileInfoOpt->isReadable();

        return ensureFilled(QFileSystemMetaData::UserReadPermission).isReadable();
    }